

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::MergeStorage
          (RowGroupCollection *this,RowGroupCollection *data,
          optional_ptr<duckdb::DataTable,_true> table,
          optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *this_00;
  __int_type _Var1;
  pointer pSVar2;
  _Head_base<0UL,_duckdb::PersistentCollectionData_*,_false> _Var3;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var4;
  optional_ptr<duckdb::StorageCommitState,_true> oVar5;
  RowGroupCollection *pRVar6;
  pointer pPVar7;
  bool bVar8;
  RowGroupSegmentTree *pRVar9;
  type this_01;
  PersistentCollectionData *pPVar10;
  pointer pRVar11;
  pointer this_02;
  pointer this_03;
  pointer pSVar12;
  pointer pSVar13;
  idx_t iVar14;
  unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
  row_group_data;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> segments;
  PersistentRowGroupData persistent_data;
  ulong local_e0;
  _Head_base<0UL,_duckdb::PersistentCollectionData_*,_false> local_d8;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_d0;
  optional_ptr<duckdb::StorageCommitState,_true> local_c8;
  __int_type local_c0;
  RowGroupCollection *local_b8;
  PersistentCollectionData *local_b0;
  optional_ptr<duckdb::DataTable,_true> local_a8;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  local_a0;
  RowGroupCollection *local_88;
  vector<duckdb::LogicalType,_true> *local_80;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *local_78;
  PersistentRowGroupData local_70;
  
  iVar14 = this->row_start;
  local_c0 = (this->total_rows).super___atomic_base<unsigned_long>._M_i;
  local_c8.ptr = commit_state.ptr;
  local_b8 = this;
  local_a8.ptr = table.ptr;
  pRVar9 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&data->row_groups);
  SegmentTree<duckdb::RowGroup,_true>::MoveSegments
            ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)&local_a0,
             &pRVar9->super_SegmentTree<duckdb::RowGroup,_true>);
  pSVar12 = local_a0.
            super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_d8._M_head_impl = (PersistentCollectionData *)0x0;
  local_88 = data;
  if (local_c8.ptr != (StorageCommitState *)0x0) {
    if (local_a0.
        super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_a0.
        super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_e0 = 0;
    }
    else {
      local_e0 = 0;
      pSVar2 = local_a0.
               super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pSVar13 = pSVar2 + 1;
        this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                  operator*(&pSVar2->node);
        bVar8 = RowGroup::IsPersistent(this_01);
        if (bVar8) {
          local_e0 = local_e0 +
                     (this_01->super_SegmentBase<duckdb::RowGroup>).count.
                     super___atomic_base<unsigned_long>._M_i;
        }
        pSVar2 = pSVar13;
      } while (bVar8 && pSVar13 != pSVar12);
    }
    if (local_e0 != 0) {
      pPVar10 = (PersistentCollectionData *)operator_new(0x18);
      _Var3._M_head_impl = local_d8._M_head_impl;
      (((_Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
         *)&pPVar10->row_group_data)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
         *)&pPVar10->row_group_data)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
         *)&pPVar10->row_group_data)->_M_impl).super__Vector_impl_data._M_end_of_storage =
           (pointer)0x0;
      bVar8 = local_d8._M_head_impl != (PersistentCollectionData *)0x0;
      local_d8._M_head_impl = pPVar10;
      if (bVar8) {
        ::std::
        vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
        ~vector((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 *)_Var3._M_head_impl);
        operator_delete(_Var3._M_head_impl);
      }
      goto LAB_017b665c;
    }
  }
  local_e0 = 0;
LAB_017b665c:
  iVar14 = local_c0 + iVar14;
  local_c0 = iVar14;
  if (local_a0.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_80 = &local_b8->types;
    local_78 = &local_b8->row_groups;
    pSVar12 = local_a0.
              super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = &pSVar12->node;
      pRVar11 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                operator->(this_00);
      RowGroup::MoveToCollection(pRVar11,local_b8,iVar14);
      if ((local_c8.ptr != (StorageCommitState *)0x0) && (iVar14 - local_c0 < local_e0)) {
        pRVar11 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                  operator->(this_00);
        RowGroup::SerializeRowGroupInfo(&local_70,pRVar11);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70,
                   &local_80->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        this_02 = unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                  ::operator->((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                                *)&local_d8);
        ::std::
        vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
        emplace_back<duckdb::PersistentRowGroupData>
                  ((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                    *)this_02,&local_70);
        pPVar7 = local_70.column_data.
                 super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                 .
                 super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_03 = local_70.column_data.
                       super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                       .
                       super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_03 != pPVar7;
            this_03 = this_03 + 1) {
          PersistentColumnData::~PersistentColumnData(this_03);
        }
        if (local_70.column_data.
            super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
            .
            super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
            ._M_impl.super__Vector_impl_data._M_start != (PersistentColumnData *)0x0) {
          operator_delete(local_70.column_data.
                          super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                          .
                          super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_70);
      }
      pRVar11 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::
                operator->(this_00);
      _Var1 = (pRVar11->super_SegmentBase<duckdb::RowGroup>).count.
              super___atomic_base<unsigned_long>._M_i;
      pRVar9 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(local_78);
      local_d0._M_head_impl =
           (this_00->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>).
           _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t
           .super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
           super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
      super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
      super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
      SegmentTree<duckdb::RowGroup,_true>::AppendSegment
                (&pRVar9->super_SegmentTree<duckdb::RowGroup,_true>,
                 (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 &local_d0);
      _Var4._M_head_impl = local_d0._M_head_impl;
      if (local_d0._M_head_impl != (RowGroup *)0x0) {
        RowGroup::~RowGroup(local_d0._M_head_impl);
        operator_delete(_Var4._M_head_impl);
      }
      iVar14 = iVar14 + _Var1;
      local_d0._M_head_impl = (RowGroup *)0x0;
      pSVar12 = pSVar12 + 1;
    } while (pSVar12 !=
             local_a0.
             super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pRVar6 = local_88;
  if ((local_e0 != 0) && (local_c8.ptr != (StorageCommitState *)0x0)) {
    optional_ptr<duckdb::StorageCommitState,_true>::CheckValid(&local_c8);
    oVar5.ptr = local_c8.ptr;
    optional_ptr<duckdb::DataTable,_true>::CheckValid(&local_a8);
    local_b0 = local_d8._M_head_impl;
    local_d8._M_head_impl = (PersistentCollectionData *)0x0;
    (*(oVar5.ptr)->_vptr_StorageCommitState[4])(oVar5.ptr,local_a8.ptr,local_c0,local_e0);
    pPVar10 = local_b0;
    if (local_b0 != (PersistentCollectionData *)0x0) {
      ::std::vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
      ::~vector((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                 *)local_b0);
      operator_delete(pPVar10);
    }
    local_b0 = (PersistentCollectionData *)0x0;
  }
  TableStatistics::MergeStats(&local_b8->stats,&pRVar6->stats);
  _Var3._M_head_impl = local_d8._M_head_impl;
  LOCK();
  (local_b8->total_rows).super___atomic_base<unsigned_long>._M_i =
       (local_b8->total_rows).super___atomic_base<unsigned_long>._M_i +
       (pRVar6->total_rows).super___atomic_base<unsigned_long>._M_i;
  UNLOCK();
  if (local_d8._M_head_impl != (PersistentCollectionData *)0x0) {
    ::std::vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>::
    ~vector((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
             *)local_d8._M_head_impl);
    operator_delete(_Var3._M_head_impl);
  }
  ::std::
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
  ::~vector(&local_a0);
  return;
}

Assistant:

void RowGroupCollection::MergeStorage(RowGroupCollection &data, optional_ptr<DataTable> table,
                                      optional_ptr<StorageCommitState> commit_state) {
	D_ASSERT(data.types == types);
	auto start_index = row_start + total_rows.load();
	auto index = start_index;
	auto segments = data.row_groups->MoveSegments();

	// check if the row groups we are merging are optimistically written
	// if all row groups are optimistically written we keep around the block pointers
	unique_ptr<PersistentCollectionData> row_group_data;
	idx_t optimistically_written_count = 0;
	if (commit_state) {
		for (auto &entry : segments) {
			auto &row_group = *entry.node;
			if (!row_group.IsPersistent()) {
				break;
			}
			optimistically_written_count += row_group.count;
		}
		if (optimistically_written_count > 0) {
			row_group_data = make_uniq<PersistentCollectionData>();
		}
	}
	for (auto &entry : segments) {
		auto &row_group = entry.node;
		row_group->MoveToCollection(*this, index);

		if (commit_state && (index - start_index) < optimistically_written_count) {
			// serialize the block pointers of this row group
			auto persistent_data = row_group->SerializeRowGroupInfo();
			persistent_data.types = types;
			row_group_data->row_group_data.push_back(std::move(persistent_data));
		}
		index += row_group->count;
		row_groups->AppendSegment(std::move(row_group));
	}
	if (commit_state && optimistically_written_count > 0) {
		// if we have serialized the row groups - push the serialized block pointers into the commit state
		commit_state->AddRowGroupData(*table, start_index, optimistically_written_count, std::move(row_group_data));
	}
	stats.MergeStats(data.stats);
	total_rows += data.total_rows.load();
}